

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix4 * matrix4_invert(matrix4 *self)

{
  matrix4 *pmVar1;
  matrix4 inverse;
  anon_union_64_5_d0a4420b_for_matrix4_0 local_48;
  
  pmVar1 = matrix4_inverse(self,(matrix4 *)&local_48.field_1);
  if (pmVar1 != (matrix4 *)0x0) {
    *(undefined8 *)((long)&self->field_0 + 0x30) = local_48._48_8_;
    *(undefined8 *)((long)&self->field_0 + 0x38) = local_48._56_8_;
    *(undefined8 *)((long)&self->field_0 + 0x20) = local_48._32_8_;
    *(undefined8 *)((long)&self->field_0 + 0x28) = local_48._40_8_;
    *(undefined8 *)((long)&self->field_0 + 0x10) = local_48._16_8_;
    *(undefined8 *)((long)&self->field_0 + 0x18) = local_48._24_8_;
    *(undefined8 *)&self->field_0 = local_48._0_8_;
    *(undefined8 *)((long)&self->field_0 + 8) = local_48._8_8_;
  }
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_invert(struct matrix4 *self)
{
	struct matrix4 inverse;
	uint8_t i;

	if (matrix4_inverse(self, &inverse)) {
		for (i = 0; i < 16; i++) {
			self->m[i] = inverse.m[i];
		}
	}

	return self;
}